

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O3

bool option::Parser::workhorse
               (bool gnu,Descriptor *usage,int numargs,char **args,Action *action,
               bool single_minus_longopt,bool print_errors,int min_abbr_len)

{
  char *pcVar1;
  char *pcVar2;
  char **ppcVar3;
  char cVar4;
  Descriptor *pDVar5;
  byte bVar6;
  int iVar7;
  ArgStatus AVar8;
  int iVar9;
  char *temp_1;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  char cVar16;
  Descriptor *ctx;
  char *pcVar17;
  char *pcVar18;
  bool bVar19;
  Option option;
  int local_9c;
  char **local_90;
  Option local_60;
  
  if (numargs == 0 || args == (char **)0x0) {
    iVar7 = 0;
LAB_0010e215:
    numargs = 0;
LAB_0010e217:
    iVar7 = (*action->_vptr_Action[1])(action,(ulong)(uint)(numargs + iVar7),args + -(long)iVar7);
    return (bool)(char)iVar7;
  }
  iVar7 = 0;
  local_90 = args;
LAB_0010e255:
  pcVar15 = *local_90;
  if (pcVar15 != (char *)0x0) {
    if (*pcVar15 == '-') {
      cVar16 = pcVar15[1];
      if (cVar16 != '-') {
        if (cVar16 != '\0') goto LAB_0010e28e;
        goto LAB_0010e273;
      }
      if (pcVar15[2] != '\0') {
LAB_0010e28e:
        bVar19 = cVar16 != '-';
        pcVar18 = pcVar15 + 2;
        if (bVar19) {
          pcVar18 = pcVar15 + 1;
        }
        local_9c = numargs;
        bVar6 = single_minus_longopt;
LAB_0010e2c7:
        pcVar13 = pcVar15;
LAB_0010e2cc:
        if ((~bVar6 & bVar19) == 0) {
          pcVar15 = usage->longopt;
          if (pcVar15 == (char *)0x0) {
            uVar11 = 0;
          }
          else {
            uVar10 = 0;
            pcVar17 = pcVar15;
            do {
              lVar12 = 0;
              do {
                pcVar1 = pcVar17 + lVar12;
                if (*pcVar1 == '\0') {
                  uVar11 = uVar10;
                  if ((pcVar18[lVar12] == '\0') || (pcVar18[lVar12] == '=')) goto LAB_0010e4ca;
                  break;
                }
                pcVar2 = pcVar18 + lVar12;
                lVar12 = lVar12 + 1;
              } while (*pcVar1 == *pcVar2);
              uVar11 = uVar10 + 1;
              pcVar17 = usage[uVar10 + 1].longopt;
              uVar10 = uVar11;
            } while (pcVar17 != (char *)0x0);
            if (0 < min_abbr_len && pcVar15 != (char *)0x0) {
              lVar12 = 1;
              uVar10 = 0;
              do {
                cVar16 = *pcVar15;
                pcVar17 = pcVar18;
                if (cVar16 != '\0') {
                  lVar14 = 0;
                  do {
                    if (cVar16 != pcVar18[lVar14]) {
                      if (lVar14 < (long)(ulong)(uint)min_abbr_len) goto LAB_0010e391;
                      break;
                    }
                    cVar16 = pcVar15[lVar14 + 1];
                    lVar14 = lVar14 + 1;
                  } while (cVar16 != '\0');
                  pcVar17 = pcVar18 + lVar14;
                }
                if ((*pcVar17 == '\0') || (*pcVar17 == '=')) {
                  pcVar15 = usage[(int)uVar10 + 1].longopt;
                  goto LAB_0010e47b;
                }
LAB_0010e391:
                pcVar15 = usage[uVar10 + 1].longopt;
                lVar12 = lVar12 + 1;
                uVar10 = uVar10 + 1;
              } while (pcVar15 != (char *)0x0);
            }
          }
          goto LAB_0010e4ca;
        }
        uVar11 = 0;
LAB_0010e3ac:
        pcVar17 = (char *)0x0;
        goto LAB_0010e3af;
      }
      if (0 < iVar7) {
        pcVar15 = *local_90;
        lVar12 = 0;
        do {
          local_90[lVar12] = local_90[lVar12 + -1];
          local_90[lVar12 + -1] = pcVar15;
          lVar12 = lVar12 + -1;
        } while (-iVar7 < lVar12);
      }
      local_90 = local_90 + 1;
      numargs = numargs - (uint)(0 < numargs);
    }
    else {
LAB_0010e273:
      if (gnu) {
        iVar7 = iVar7 + 1;
        goto LAB_0010e657;
      }
    }
  }
  args = local_90;
  if (0 < numargs) {
    if (*local_90 == (char *)0x0) {
      numargs = 0;
    }
    goto LAB_0010e217;
  }
  if (numargs < 0) {
    lVar12 = 0;
    do {
      ppcVar3 = local_90 + lVar12;
      lVar12 = lVar12 + 1;
    } while (*ppcVar3 != (char *)0x0);
    numargs = (int)lVar12 + -1;
    goto LAB_0010e217;
  }
  goto LAB_0010e215;
LAB_0010e47b:
  if (pcVar15 == (char *)0x0) goto LAB_0010e4c4;
  cVar16 = *pcVar15;
  pcVar17 = pcVar18;
  if (cVar16 != '\0') {
    lVar14 = 0;
    do {
      if (cVar16 != pcVar18[lVar14]) {
        if (lVar14 < (long)(ulong)(uint)min_abbr_len) goto LAB_0010e4b6;
        break;
      }
      cVar16 = pcVar15[lVar14 + 1];
      lVar14 = lVar14 + 1;
    } while (cVar16 != '\0');
    pcVar17 = pcVar18 + lVar14;
  }
  if ((*pcVar17 == '\0') || (*pcVar17 == '=')) goto LAB_0010e4ca;
LAB_0010e4b6:
  pcVar15 = usage[lVar12 + 1].longopt;
  lVar12 = lVar12 + 1;
  goto LAB_0010e47b;
LAB_0010e4c4:
  uVar11 = uVar10 & 0xffffffff;
LAB_0010e4ca:
  pcVar15 = pcVar18;
  if (usage[(int)uVar11].longopt != (char *)0x0) {
    bVar19 = false;
  }
  do {
    pcVar17 = pcVar15 + 1;
    cVar16 = *pcVar15;
    if (cVar16 == '\0') {
      if (numargs == 1) goto LAB_0010e3ac;
      pcVar17 = local_90[1];
      break;
    }
    pcVar15 = pcVar17;
  } while (cVar16 != '=');
LAB_0010e3af:
  pcVar15 = pcVar13;
  if (bVar19 != false) {
    cVar16 = pcVar13[1];
    if (cVar16 == '\0') goto LAB_0010e617;
    pcVar15 = usage->shortopt;
    uVar11 = 0;
    while (pcVar15 != (char *)0x0) {
      do {
        cVar4 = *pcVar15;
        if (cVar4 == '\0') break;
        pcVar15 = pcVar15 + 1;
      } while (cVar4 != cVar16);
      if (cVar4 == cVar16) break;
      pcVar15 = usage[uVar11 + 1].shortopt;
      uVar11 = uVar11 + 1;
    }
    pcVar15 = pcVar13 + 1;
    pcVar17 = pcVar13 + 2;
    if (pcVar13[2] == '\0') {
      pcVar17 = (char *)0x0;
    }
    if ((numargs != 1) && (pcVar13[2] == '\0')) {
      pcVar17 = local_90[1];
    }
  }
  if (usage[(int)uVar11].shortopt != (char *)0x0) goto LAB_0010e609;
  pcVar13 = usage->shortopt;
  ctx = usage;
  while (pcVar13 != (char *)0x0) {
    if ((*pcVar13 == '\0') && (*ctx->longopt == '\0')) goto LAB_0010e515;
    pDVar5 = ctx + 1;
    ctx = ctx + 1;
    pcVar13 = pDVar5->shortopt;
  }
  bVar6 = 0;
  pcVar13 = pcVar15;
  if (bVar19 == false) goto LAB_0010e617;
  goto LAB_0010e2cc;
LAB_0010e617:
  numargs = local_9c;
  if (0 < iVar7) {
    pcVar15 = *local_90;
    lVar12 = 0;
    do {
      local_90[lVar12] = local_90[lVar12 + -1];
      local_90[lVar12 + -1] = pcVar15;
      lVar12 = lVar12 + -1;
    } while (-iVar7 < lVar12);
  }
LAB_0010e657:
  local_90 = local_90 + 1;
  numargs = numargs - (uint)(0 < numargs);
  args = local_90;
  if (numargs == 0) goto LAB_0010e215;
  goto LAB_0010e255;
LAB_0010e609:
  ctx = usage + (int)uVar11;
LAB_0010e515:
  Option::init(&local_60,(EVP_PKEY_CTX *)ctx);
  AVar8 = (*ctx->check_arg)(&local_60,print_errors);
  switch(AVar8) {
  case ARG_NONE:
  case ARG_IGNORE:
    local_60.arg = (char *)0x0;
    break;
  case ARG_OK:
    if (((numargs != 1) && (pcVar17 != (char *)0x0)) && (pcVar17 == local_90[1])) {
      if (0 < iVar7) {
        pcVar13 = *local_90;
        lVar12 = 0;
        do {
          local_90[lVar12] = local_90[lVar12 + -1];
          local_90[lVar12 + -1] = pcVar13;
          lVar12 = lVar12 + -1;
        } while (-iVar7 < lVar12);
      }
      local_90 = local_90 + 1;
      local_9c = local_9c - (uint)(0 < local_9c);
    }
    bVar19 = false;
    break;
  case ARG_ILLEGAL:
    goto LAB_0010e234;
  }
  iVar9 = (**action->_vptr_Action)(action,&local_60);
  if ((char)iVar9 != '\0') {
    bVar6 = 0;
    if (bVar19 == false) goto LAB_0010e617;
    goto LAB_0010e2c7;
  }
LAB_0010e234:
  return false;
}

Assistant:

inline bool Parser::workhorse(bool gnu, const Descriptor usage[], int numargs, const char** args, Action& action,
                              bool single_minus_longopt, bool print_errors, int min_abbr_len)
{
  // protect against NULL pointer
  if (args == 0)
    numargs = 0;

  int nonops = 0;

  while (numargs != 0 && *args != 0)
  {
    const char* param = *args; // param can be --long-option, -srto or non-option argument

    // in POSIX mode the first non-option argument terminates the option list
    // a lone minus character is a non-option argument
    if (param[0] != '-' || param[1] == 0)
    {
      if (gnu)
      {
        ++nonops;
        ++args;
        if (numargs > 0)
          --numargs;
        continue;
      }
      else
        break;
    }

    // -- terminates the option list. The -- itself is skipped.
    if (param[1] == '-' && param[2] == 0)
    {
      shift(args, nonops);
      ++args;
      if (numargs > 0)
        --numargs;
      break;
    }

    bool handle_short_options;
    const char* longopt_name;
    if (param[1] == '-') // if --long-option
    {
      handle_short_options = false;
      longopt_name = param + 2;
    }
    else
    {
      handle_short_options = true;
      longopt_name = param + 1; //for testing a potential -long-option
    }

    bool try_single_minus_longopt = single_minus_longopt;
    bool have_more_args = (numargs > 1 || numargs < 0); // is referencing argv[1] valid?

    do // loop over short options in group, for long options the body is executed only once
    {
      int idx = 0;

      const char* optarg = 0;

      /******************** long option **********************/
      if (handle_short_options == false || try_single_minus_longopt)
      {
        idx = 0;
        while (usage[idx].longopt != 0 && !streq(usage[idx].longopt, longopt_name))
          ++idx;

        if (usage[idx].longopt == 0 && min_abbr_len > 0) // if we should try to match abbreviated long options
        {
          int i1 = 0;
          while (usage[i1].longopt != 0 && !streqabbr(usage[i1].longopt, longopt_name, min_abbr_len))
            ++i1;
          if (usage[i1].longopt != 0)
          { // now test if the match is unambiguous by checking for another match
            int i2 = i1 + 1;
            while (usage[i2].longopt != 0 && !streqabbr(usage[i2].longopt, longopt_name, min_abbr_len))
              ++i2;

            if (usage[i2].longopt == 0) // if there was no second match it's unambiguous, so accept i1 as idx
              idx = i1;
          }
        }

        // if we found something, disable handle_short_options (only relevant if single_minus_longopt)
        if (usage[idx].longopt != 0)
          handle_short_options = false;

        try_single_minus_longopt = false; // prevent looking for longopt in the middle of shortopt group

        optarg = longopt_name;
        while (*optarg != 0 && *optarg != '=')
          ++optarg;
        if (*optarg == '=') // attached argument
          ++optarg;
        else
          // possibly detached argument
          optarg = (have_more_args ? args[1] : 0);
      }

      /************************ short option ***********************************/
      if (handle_short_options)
      {
        if (*++param == 0) // point at the 1st/next option character
          break; // end of short option group

        idx = 0;
        while (usage[idx].shortopt != 0 && !instr(*param, usage[idx].shortopt))
          ++idx;

        if (param[1] == 0) // if the potential argument is separate
          optarg = (have_more_args ? args[1] : 0);
        else
          // if the potential argument is attached
          optarg = param + 1;
      }

      const Descriptor* descriptor = &usage[idx];

      if (descriptor->shortopt == 0) /**************  unknown option ********************/
      {
        // look for dummy entry (shortopt == "" and longopt == "") to use as Descriptor for unknown options
        idx = 0;
        while (usage[idx].shortopt != 0 && (usage[idx].shortopt[0] != 0 || usage[idx].longopt[0] != 0))
          ++idx;
        descriptor = (usage[idx].shortopt == 0 ? 0 : &usage[idx]);
      }

      if (descriptor != 0)
      {
        Option option(descriptor, param, optarg);
        switch (descriptor->check_arg(option, print_errors))
        {
          case ARG_ILLEGAL:
            return false; // fatal
          case ARG_OK:
            // skip one element of the argument vector, if it's a separated argument
            if (optarg != 0 && have_more_args && optarg == args[1])
            {
              shift(args, nonops);
              if (numargs > 0)
                --numargs;
              ++args;
            }

            // No further short options are possible after an argument
            handle_short_options = false;

            break;
          case ARG_IGNORE:
          case ARG_NONE:
            option.arg = 0;
            break;
        }

        if (!action.perform(option))
          return false;
      }

    } while (handle_short_options);

    shift(args, nonops);
    ++args;
    if (numargs > 0)
      --numargs;

  } // while

  if (numargs > 0 && *args == 0) // It's a bug in the caller if numargs is greater than the actual number
    numargs = 0; // of arguments, but as a service to the user we fix this if we spot it.

  if (numargs < 0) // if we don't know the number of remaining non-option arguments
  { // we need to count them
    numargs = 0;
    while (args[numargs] != 0)
      ++numargs;
  }

  return action.finished(numargs + nonops, args - nonops);
}